

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_suite.cpp
# Opt level: O0

void __thiscall parser_suite::test_empty::test_method(test_empty *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  string_type local_310;
  basic_cstring<const_char> local_2f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2e0;
  basic_cstring<const_char> local_2b8;
  basic_cstring<const_char> local_2a8;
  string_type local_298;
  basic_cstring<const_char> local_278;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_268;
  basic_cstring<const_char> local_240;
  basic_cstring<const_char> local_230;
  string_type local_220;
  basic_cstring<const_char> local_200;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1f0;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  string_type local_1a8;
  basic_cstring<const_char> local_188;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_178;
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> local_140;
  string_type local_130;
  basic_cstring<const_char> local_100;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f0;
  basic_cstring<const_char> local_c8;
  basic_cstring<const_char> local_b8;
  basic_string_ref<char,_std::char_traits<char>_> local_a8;
  undefined1 local_98 [8];
  parser parser;
  char input [1];
  test_empty *this_local;
  
  memset((void *)((long)&parser.current_fragment.len_ + 7),0,1);
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
            (&local_a8,(char *)((long)&parser.current_fragment.len_ + 7));
  trial::url::basic_parser<char>::basic_parser((basic_parser<char> *)local_98,&local_a8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b8,0x17,&local_c8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f0,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp"
               ,0x5b);
    trial::url::basic_parser<char>::scheme_abi_cxx11_(&local_130,(basic_parser<char> *)local_98);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (&local_f0,&local_100,0x17,2,2,&local_130,"parser.scheme()","","\"\"");
    std::__cxx11::string::~string((string *)&local_130);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_150);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_140,0x18,&local_150);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_178,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp"
               ,0x5b);
    trial::url::basic_parser<char>::authority_abi_cxx11_(&local_1a8,(basic_parser<char> *)local_98);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (&local_178,&local_188,0x18,2,2,&local_1a8,"parser.authority()","","\"\"");
    std::__cxx11::string::~string((string *)&local_1a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_178);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b8,0x19,&local_1c8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1f0,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_200,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp"
               ,0x5b);
    trial::url::basic_parser<char>::path_abi_cxx11_(&local_220,(basic_parser<char> *)local_98);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (&local_1f0,&local_200,0x19,2,2,&local_220,"parser.path()","","\"\"");
    std::__cxx11::string::~string((string *)&local_220);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_240);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_230,0x1a,&local_240);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_268,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp"
               ,0x5b);
    trial::url::basic_parser<char>::query_abi_cxx11_(&local_298,(basic_parser<char> *)local_98);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (&local_268,&local_278,0x1a,2,2,&local_298,"parser.query()","","\"\"");
    std::__cxx11::string::~string((string *)&local_298);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_268);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2a8,0x1b,&local_2b8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2e0,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp"
               ,0x5b);
    trial::url::basic_parser<char>::fragment_abi_cxx11_(&local_310,(basic_parser<char> *)local_98);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (&local_2e0,&local_2f0,0x1b,2,2,&local_310,"parser.fragment()","","\"\"");
    std::__cxx11::string::~string((string *)&local_310);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_empty)
{
    const char input[] = "";
    url::parser parser(input);
    BOOST_REQUIRE_EQUAL(parser.scheme(), "");
    BOOST_REQUIRE_EQUAL(parser.authority(), "");
    BOOST_REQUIRE_EQUAL(parser.path(), "");
    BOOST_REQUIRE_EQUAL(parser.query(), "");
    BOOST_REQUIRE_EQUAL(parser.fragment(), "");
}